

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBlob.cpp
# Opt level: O2

bool __thiscall jbcoin::STBlob::isEquivalent(STBlob *this,STBase *t)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  if (lVar2 != 0) {
    bVar1 = jbcoin::operator==(&this->value_,(Buffer *)(lVar2 + 0x10));
    return bVar1;
  }
  return false;
}

Assistant:

bool
STBlob::isEquivalent (const STBase& t) const
{
    const STBlob* v = dynamic_cast<const STBlob*> (&t);
    return v && (value_ == v->value_);
}